

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfVecAttribute.cpp
# Opt level: O2

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Vec3<int>_>::writeValueTo
          (TypedAttribute<Imath_3_2::Vec3<int>_> *this,OStream *os,int version)

{
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).x);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).y);
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(this->_value).z);
  return;
}

Assistant:

IMF_EXPORT void
V3iAttribute::writeValueTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, int version) const
{
    Xdr::write<StreamIO> (os, _value.x);
    Xdr::write<StreamIO> (os, _value.y);
    Xdr::write<StreamIO> (os, _value.z);
}